

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O2

size_t __thiscall
Potassco::ProgramOptions::OptionContext::findGroupKey(OptionContext *this,string *name)

{
  pointer pOVar1;
  __type _Var2;
  size_t sVar3;
  long lVar4;
  size_t i;
  size_t sVar5;
  
  lVar4 = 0;
  sVar5 = 0;
  while ((pOVar1 = (this->groups_).
                   super__Vector_base<Potassco::ProgramOptions::OptionGroup,_std::allocator<Potassco::ProgramOptions::OptionGroup>_>
                   ._M_impl.super__Vector_impl_data._M_start, sVar3 = 0xffffffffffffffff,
         sVar5 != (long)(this->groups_).
                        super__Vector_base<Potassco::ProgramOptions::OptionGroup,_std::allocator<Potassco::ProgramOptions::OptionGroup>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar1 >> 6 &&
         (_Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&(pOVar1->caption_)._M_dataplus._M_p + lVar4),name),
         sVar3 = sVar5, !_Var2))) {
    sVar5 = sVar5 + 1;
    lVar4 = lVar4 + 0x40;
  }
  return sVar3;
}

Assistant:

size_t OptionContext::findGroupKey(const std::string& name) const {
	for (size_t i = 0; i != groups_.size(); ++i) {
		if (groups_[i].caption() == name) { return i; }
	}
	return size_t(-1);
}